

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O0

zt_ipv4_node * zt_ipv4_tbl_search_from_str(zt_ipv4_tbl *tbl,char *netstr)

{
  char *in_RSI;
  zt_ipv4_node *in_RDI;
  zt_ipv4_node *matched;
  zt_ipv4_node *ipv4_node;
  zt_ipv4_tbl *in_stack_fffffffffffffff8;
  zt_ipv4_node *pzVar1;
  
  if ((in_RDI == (zt_ipv4_node *)0x0) || (in_RSI == (char *)0x0)) {
    pzVar1 = (zt_ipv4_node *)0x0;
  }
  else {
    pzVar1 = zt_ipv4_node_str_init(in_RSI);
    if (pzVar1 == (zt_ipv4_node *)0x0) {
      pzVar1 = (zt_ipv4_node *)0x0;
    }
    else {
      pzVar1 = zt_ipv4_tbl_search_node(in_stack_fffffffffffffff8,in_RDI);
      zt_mem_pool_release(&in_RDI->next);
    }
  }
  return pzVar1;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_tbl_search_from_str(zt_ipv4_tbl * tbl, const char *netstr)
{
    zt_ipv4_node *ipv4_node = NULL;
    zt_ipv4_node *matched = NULL;

    if (!tbl || !netstr) {
        return NULL;
    }

    if (!(ipv4_node = zt_ipv4_node_str_init(netstr))) {
        return NULL;
    }

    matched = zt_ipv4_tbl_search_node(tbl, ipv4_node);

    zt_mem_pool_release((void **)&ipv4_node);

    return matched;
}